

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

unsigned_short __thiscall
IDisk::GetTrackInfoForRev(IDisk *this,int side,int track,Track *track_buffer,int rev)

{
  pointer *ppaVar1;
  Revolution *pRVar2;
  uchar *puVar3;
  ILog *pIVar4;
  long lVar5;
  iterator __position;
  pointer paVar6;
  undefined8 uVar7;
  uchar uVar8;
  uchar uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint *puVar14;
  byte bVar15;
  unsigned_short uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte b;
  ushort uVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  CRC crc_local;
  undefined1 local_bc;
  undefined1 local_b8;
  anon_struct_36_14_4aa84ee9 local_a8;
  Side *local_80;
  long local_78;
  Track *local_70;
  undefined8 local_68;
  IDisk *local_60;
  CRC local_58;
  
  CRC::CRC(&local_58);
  lVar19 = (long)rev;
  local_78 = (long)track * 0x20;
  pRVar2 = this->side_[side].tracks[track].revolution;
  lVar20 = lVar19 * 0x30;
  local_68 = CONCAT62((int6)((ulong)local_78 >> 0x10),0x100);
  if (pRVar2[lVar19].size != 0x40) {
    local_80 = this->side_ + side;
    uVar28 = 0;
    local_68 = CONCAT62((int6)((ulong)local_80 >> 0x10),0x100);
    local_70 = track_buffer;
    local_60 = this;
    do {
      bVar29 = 0x80 < uVar28;
      if (bVar29) {
        puVar3 = pRVar2[lVar19].bitfield;
        iVar10 = bcmp(&DAT_001a8b70,puVar3 + uVar28,0x40);
        bVar29 = iVar10 == 0;
        if (bVar29) {
          uVar11 = uVar28 - 0x50;
          bVar29 = true;
          uVar21 = 0;
          do {
            if ((puVar3[uVar11] != '\x01') || (puVar3[uVar11 + 1] != '\0')) {
              bVar29 = false;
            }
            if (0x26 < uVar21) break;
            uVar21 = uVar21 + 1;
            uVar11 = uVar11 + 2;
          } while (bVar29);
        }
      }
      if (bVar29) {
        CRC::Reset(&local_58);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xa1);
        CRC::AddByteToCrc(&local_58,0xfe);
        local_a8.c = '\0';
        local_a8.h = '\0';
        local_a8.r = '\0';
        local_a8.n = '\0';
        local_a8.chrn_crc_ok = false;
        local_a8.status1 = '\0';
        local_a8.status2 = '\0';
        local_a8._15_1_ = 0;
        local_a8.real_size = 0;
        local_a8._18_2_ = 0;
        local_a8.dam_offset = 0;
        local_a8.dam_sync_offset = 0;
        local_a8.data_crc_ok = false;
        local_a8._29_3_ = 0;
        local_a8.index_end = 0;
        local_a8.idam_sync_offset = uVar28 - 0x50;
        local_a8.idam_offset = uVar28;
        uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x40,rev);
        local_a8.c = uVar8;
        CRC::AddByteToCrc(&local_58,uVar8);
        uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x50,rev);
        local_a8.h = uVar8;
        CRC::AddByteToCrc(&local_58,uVar8);
        uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x60,rev);
        local_a8.r = uVar8;
        CRC::AddByteToCrc(&local_58,uVar8);
        uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x70,rev);
        local_a8.n = uVar8;
        CRC::AddByteToCrc(&local_58,uVar8);
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (*(code *)**(undefined8 **)pIVar4)(pIVar4,"Track : ");
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          local_bc = (undefined1)track;
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_bc);
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (*(code *)**(undefined8 **)pIVar4)(pIVar4," - REV :");
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          local_b8 = (undefined1)rev;
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_b8);
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (*(code *)**(undefined8 **)pIVar4)(pIVar4," -> CHRN Found");
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_a8._8_8_ & 0xff);
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_a8.h);
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_a8.r);
        }
        pIVar4 = this->log_;
        if (pIVar4 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar4 + 8))(pIVar4,local_a8.n);
        }
        uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x80,rev);
        uVar9 = GetNextByteForRev(this,side,track,uVar28 + 0x90,rev);
        track_buffer = local_70;
        uVar7 = local_a8._8_8_;
        if (CONCAT11(uVar8,uVar9) == local_58.computed_crc_) {
          local_a8.chrn_crc_ok = true;
        }
        else {
          local_a8._8_5_ = CONCAT14(false,local_a8._8_4_);
          local_a8.status1 = SUB81(uVar7,5);
          local_a8._14_2_ = SUB82(uVar7,6);
          local_a8._8_8_ =
               CONCAT26(local_a8._14_2_,CONCAT15(local_a8.status1,local_a8._8_5_)) | 0x200000000000;
          pIVar4 = this->log_;
          if (pIVar4 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar4)(pIVar4,"HEADER CRC ERROR !");
          }
        }
        if (this->log_ != (ILog *)0x0) {
          (**(code **)(*(long *)this->log_ + 0x20))();
        }
        uVar28 = uVar28 + 0xa0;
        lVar5 = *(long *)((long)&local_80->tracks->revolution + local_78);
        if (uVar28 < *(int *)(lVar5 + 8 + lVar20) - 0x38U) {
          bVar29 = false;
          do {
            lVar5 = *(long *)(lVar5 + lVar20);
            iVar10 = bcmp(&DAT_001a8b70,(void *)((ulong)uVar28 + lVar5),0x38);
            bVar30 = iVar10 == 0;
            if (bVar30) {
              uVar11 = uVar28 - 0x50;
              bVar30 = true;
              lVar22 = 0x28;
              do {
                if ((*(char *)(lVar5 + (ulong)uVar11) != '\x01') ||
                   (*(char *)(lVar5 + (ulong)(uVar11 + 1)) != '\0')) {
                  bVar30 = false;
                }
                uVar11 = uVar11 + 2;
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
            }
            if (bVar30) {
              local_a8.dam_offset = uVar28;
              local_a8.dam_sync_offset = uVar28 - 0x50;
              CRC::Reset(&local_58);
              CRC::AddByteToCrc(&local_58,0xa1);
              CRC::AddByteToCrc(&local_58,0xa1);
              CRC::AddByteToCrc(&local_58,0xa1);
              uVar8 = GetNextByteForRev(this,side,track,uVar28 + 0x30,rev);
              CRC::AddByteToCrc(&local_58,uVar8);
              pIVar4 = this->log_;
              if (pIVar4 != (ILog *)0x0) {
                (*(code *)**(undefined8 **)pIVar4)(pIVar4," DATA FOUND : A1A1A1-");
              }
              pIVar4 = this->log_;
              if (pIVar4 != (ILog *)0x0) {
                (**(code **)(*(long *)pIVar4 + 8))(pIVar4,uVar8);
              }
              if (this->log_ != (ILog *)0x0) {
                (**(code **)(*(long *)this->log_ + 0x20))();
              }
              if (uVar8 == 0xf8) {
                local_a8._8_8_ = local_a8._8_8_ | 0x40000000000000;
              }
              bVar15 = local_a8.n & 7;
              uVar11 = uVar28 + 0x70;
              iVar10 = 0;
              uVar28 = uVar28 + 0x40;
              do {
                uVar12 = uVar28;
                uVar21 = (ulong)uVar11;
                uVar28 = uVar12 + 0x10;
                lVar5 = *(long *)((long)&local_80->tracks->revolution + local_78);
                uVar24 = *(uint *)(lVar5 + 8 + lVar20);
                if (uVar28 < uVar24) {
                  uVar8 = GetNextByteForRev(local_60,side,track,uVar12,rev);
                  CRC::AddByteToCrc(&local_58,uVar8);
                }
                else {
                  uVar25 = 0xfffffffe;
                  b = 0;
                  uVar17 = uVar12;
                  do {
                    uVar18 = uVar17;
                    if (uVar24 <= uVar17) {
                      uVar18 = uVar17 % uVar24;
                    }
                    uVar17 = uVar17 + 2;
                    b = *(byte *)(*(long *)(lVar5 + lVar20) + (long)(int)uVar18) & 1 | b * '\x02';
                    uVar25 = uVar25 + 2;
                  } while (uVar25 < 0xe);
                  CRC::AddByteToCrc(&local_58,b);
                }
                this = local_60;
                track_buffer = local_70;
                local_a8.real_size = local_a8.real_size + 1;
                iVar10 = iVar10 + 1;
                uVar11 = uVar11 + 0x10;
              } while (iVar10 != 0x80 << bVar15);
              lVar5 = *(long *)((long)&local_80->tracks->revolution + local_78);
              uVar11 = *(uint *)(lVar5 + 8 + lVar20);
              if (uVar28 < uVar11 - 0x20) {
                uVar8 = GetNextByteForRev(local_60,side,track,uVar28,rev);
                uVar9 = GetNextByteForRev(this,side,track,uVar12 + 0x20,rev);
                uVar27 = CONCAT11(uVar8,uVar9);
                uVar21 = (ulong)(uVar12 + 0x30);
                track_buffer = local_70;
              }
              else {
                uVar24 = 0xfffffffe;
                uVar27 = 0;
                do {
                  uVar12 = uVar24 + uVar28 + 2;
                  if (uVar11 <= uVar12) {
                    uVar12 = uVar12 % uVar11;
                  }
                  uVar27 = uVar27 * 2 | *(byte *)(*(long *)(lVar5 + lVar20) + (long)(int)uVar12) & 1
                  ;
                  uVar24 = uVar24 + 2;
                } while (uVar24 < 0x1e);
                pIVar4 = local_60->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (*(code *)**(undefined8 **)pIVar4)(pIVar4,"Track size is too small ?!!");
                }
              }
              if (uVar27 == local_58.computed_crc_) {
                local_a8.data_crc_ok = true;
              }
              else {
                local_a8.data_crc_ok = false;
                local_a8._8_8_ = local_a8._8_8_ | 0x20200000000000;
                pIVar4 = this->log_;
                if (pIVar4 != (ILog *)0x0) {
                  (*(code *)**(undefined8 **)pIVar4)(pIVar4,"DATA CRC ERROR !");
                }
              }
              if (this->log_ != (ILog *)0x0) {
                (**(code **)(*(long *)this->log_ + 0x20))();
              }
              local_a8.index_end = (uint)uVar21;
              lVar5 = *(long *)((long)&local_80->tracks->revolution + local_78);
              if (((local_a8.index_end < *(int *)(lVar5 + 8 + lVar20) - 0x10U) &&
                  (uVar8 = GetNextByteForRev(this,side,track,local_a8.index_end,rev), uVar8 != 'K'))
                 && (uVar8 != 'N')) {
                iVar23 = local_a8._16_4_ + 2;
                uVar16 = (unsigned_short)iVar23;
                lVar22 = *(long *)(lVar5 + lVar20);
                iVar10 = bcmp(&DAT_001a8b70,(void *)(uVar21 + lVar22),0x38);
                if (iVar10 != 0) {
                  iVar10 = *(int *)(lVar5 + lVar20 + 8);
                  do {
                    uVar16 = (unsigned_short)iVar23;
                    if (iVar10 - 0x38U <= (uint)uVar21) break;
                    uVar21 = (ulong)((uint)uVar21 + 0x10);
                    iVar23 = iVar23 + 1;
                    uVar16 = (unsigned_short)iVar23;
                    iVar13 = bcmp(&DAT_001a8b70,(void *)(lVar22 + uVar21),0x38);
                  } while (iVar13 != 0);
                }
                local_a8.real_size = uVar16;
                track_buffer = local_70;
              }
              __position._M_current =
                   (track_buffer->list_sector_).
                   super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (track_buffer->list_sector_).
                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<IDisk::Sector,std::allocator<IDisk::Sector>>::
                _M_realloc_insert<IDisk::Sector_const&>
                          ((vector<IDisk::Sector,std::allocator<IDisk::Sector>> *)track_buffer,
                           __position,&local_a8);
              }
              else {
                (__position._M_current)->index_end = local_a8.index_end;
                (__position._M_current)->real_size = local_a8.real_size;
                *(undefined2 *)&(__position._M_current)->field_0x12 = local_a8._18_2_;
                (__position._M_current)->dam_offset = local_a8.dam_offset;
                (__position._M_current)->dam_sync_offset = local_a8.dam_sync_offset;
                (__position._M_current)->data_crc_ok = local_a8.data_crc_ok;
                *(undefined3 *)&(__position._M_current)->field_0x1d = local_a8._29_3_;
                (__position._M_current)->idam_offset = local_a8.idam_offset;
                (__position._M_current)->idam_sync_offset = local_a8.idam_sync_offset;
                (__position._M_current)->c = local_a8.c;
                (__position._M_current)->h = local_a8.h;
                (__position._M_current)->r = local_a8.r;
                (__position._M_current)->n = local_a8.n;
                (__position._M_current)->chrn_crc_ok = local_a8.chrn_crc_ok;
                (__position._M_current)->status1 = local_a8.status1;
                (__position._M_current)->status2 = local_a8.status2;
                (__position._M_current)->field_0xf = local_a8._15_1_;
                ppaVar1 = &(track_buffer->list_sector_).
                           super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              local_68 = CONCAT62((int6)((ulong)local_68 >> 0x10),
                                  (short)local_68 + local_a8.real_size);
              uVar28 = local_a8.idam_offset + 0x41;
              bVar29 = true;
            }
            else {
              uVar28 = uVar28 + 1;
            }
            lVar5 = *(long *)((long)&local_80->tracks->revolution + local_78);
          } while ((uVar28 < *(int *)(lVar5 + 8 + lVar20) - 0x38U) && (!bVar29));
        }
      }
      else {
        uVar28 = uVar28 + 1;
      }
      pRVar2 = *(Revolution **)((long)&local_80->tracks->revolution + local_78);
    } while (uVar28 < pRVar2[lVar19].size - 0x40);
  }
  paVar6 = (track_buffer->list_sector_).
           super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar19 = (long)(track_buffer->list_sector_).
                 super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)paVar6;
  if (lVar19 == 0) {
    uVar28 = 0;
    uVar16 = (unsigned_short)local_68;
  }
  else {
    uVar21 = (lVar19 >> 2) * -0x71c71c71c71c71c7;
    puVar14 = &paVar6->index_end;
    uVar28 = 0;
    uVar11 = 1;
    iVar10 = 0;
    do {
      if (uVar11 != 1) {
        iVar10 = (iVar10 - uVar28) + ((anon_struct_36_14_4aa84ee9 *)(puVar14 + -8))->idam_offset +
                 -0x18;
      }
      uVar28 = *puVar14;
      uVar26 = (ulong)uVar11;
      puVar14 = puVar14 + 9;
      uVar11 = uVar11 + 1;
    } while (uVar26 <= uVar21 && uVar21 - uVar26 != 0);
    iVar23 = iVar10 + 0xf;
    if (-1 < iVar10) {
      iVar23 = iVar10;
    }
    track_buffer->gap3_size_ = (int)((ulong)(long)(iVar23 >> 4) / uVar21);
    uVar28 = (uint)local_68 + 0x100;
    if ((char)local_68 == '\0') {
      uVar28 = (uint)local_68;
    }
    uVar16 = (unsigned_short)uVar28;
    uVar28 = uVar28 & 0xffff;
  }
  track_buffer->full_size_ = uVar28;
  CRC::~CRC(&local_58);
  return uVar16;
}

Assistant:

unsigned short IDisk::GetTrackInfoForRev(int side, int track, Track* track_buffer, int rev)
{
   unsigned short size;
   CRC crc_local;
   // Compute size of track :
   // Header
   size = 256;

   unsigned int index = 0;
   // States :
   // 0 - waiting for next sector id
   // 1 - waiting for next sector data
   // 2 - waiting for end of datas

   // A1 = 4489, FE =
   const char pattern_fe[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1, 0, 0
   };
   const char pattern_f[] = {
      0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 0, 0, 1,
      0, 0, 1, 0, 0, 0, 1, 0, 0, 1, 0, 1, 0, 1, 0, 1, 0, 1
   };

   while (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_fe))
   {
      // Test the pervious 8 bytes (should be '00')
      bool sync_ok = (index > 8 * 16);

      if (sync_ok)
      {
         sync_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                           sizeof(pattern_fe)) == 0);
         if (sync_ok)
         {
            for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
            {
               if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                  || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0)
               {
                  sync_ok = false;
               }
            }
         }
      }
      if (sync_ok)
      {
         // Found ! New sector
         crc_local.Reset();
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xA1);
         crc_local.AddByteToCrc(0xFE);

         Sector sector;
         memset(&sector, 0, sizeof(sector));
         // Keep the offset position !
         sector.idam_offset = index;
         sector.idam_sync_offset = index - SYNC_BIT_NUMBER * 2;

         // Adding CHRN to the next sector
         index += sizeof(pattern_fe);

         sector.c = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.c);
         index += 16;
         sector.h = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.h);
         index += 16;
         sector.r = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.r);
         index += 16;
         sector.n = GetNextByteForRev(side, track, index, rev);
         crc_local.AddByteToCrc(sector.n);
         index += 16;

         LOG("Track : ");
         LOGB(track);
         LOG(" - REV :");
         LOGB(rev);
         LOG(" -> CHRN Found");
         LOGB(sector.c);
         LOGB(sector.h);
         LOGB(sector.r);
         LOGB(sector.n);

         // Do we have CRC error ?
         unsigned short crc = GetNextByteForRev(side, track, index, rev);
         crc <<= 8;
         index += 16;
         crc |= GetNextByteForRev(side, track, index, rev);
         index += 16;

         // Set status 1
         if (crc != crc_local.GetCRC())
         {
            sector.chrn_crc_ok = false;
            sector.status1 |= 0x20;
            LOG("HEADER CRC ERROR !");
         }
         else
         {
            sector.chrn_crc_ok = true;
         }
         LOGEOL
         // Now, waiting for A1A1A1F8/B
         bool data_found = false;
         while ((index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)) && (!data_found))
         {
            bool data_ok = (memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                   sizeof(pattern_f)) == 0);

            if (data_ok)
            {
               for (int i = 0; i < SYNC_BIT_NUMBER && sync_ok; i++)
               {
                  if (side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2] != 1
                     || side_[side].tracks[track].revolution[rev].bitfield[index - SYNC_BIT_NUMBER * 2 + i * 2 + 1] != 0
                  )
                  {
                     data_ok = false;
                  }
               }
            }

            if (data_ok)
            {
               data_found = true;
               // Keep the offset position
               sector.dam_offset = index;
               sector.dam_sync_offset = index - SYNC_BIT_NUMBER * 2;

               // Yeah
               index += sizeof(pattern_f) - 8;

               // Set the Status according to the F8/FB
               crc_local.Reset();
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               crc_local.AddByteToCrc(0xA1);
               unsigned char byte = GetNextByteForRev(side, track, index, rev);
               crc_local.AddByteToCrc(byte);
               LOG(" DATA FOUND : A1A1A1-");
               LOGB(byte);
               LOGEOL

               index += 16;

               if (byte == 0xF8) // Erased
               {
                  sector.status2 |= 0x40;
               }

               // Now, gather datas...
               int sizeMaxSector = (sector.n & 0x7);
               for (int data_count = 0; data_count < (0x80 << sizeMaxSector); data_count++)
               {
                  if (index + 16 < side_[side].tracks[track].revolution[rev].size)
                  {
                     byte = GetNextByteForRev(side, track, index, rev);
                     crc_local.AddByteToCrc(byte);
                     sector.real_size++;
                     index += 16;
                  }
                  else
                  {
                     // Go through the index hole
                     unsigned char return_value = 0;

                     for (int i = 0; i < 16; i += 2)
                     {
                        int readoffset;
                        return_value <<= 1;
                        if (index >= side_[side].tracks[track].revolution[rev].size)
                        {
                           readoffset = index % side_[side].tracks[track].revolution[rev].size;
                        }
                        else
                        {
                           readoffset = index;
                        }
                        unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                        index += 2;
                        return_value |= b & 0x1;
                     }
                     crc_local.AddByteToCrc(return_value);
                     sector.real_size++;
                     //index = readoffset;
                  }
               }
               if (index < side_[side].tracks[track].revolution[rev].size - 32)
               {
                  // CRC Check
                  crc = GetNextByteForRev(side, track, index, rev);
                  crc <<= 8;
                  index += 16;
                  crc |= GetNextByteForRev(side, track, index, rev);
                  index += 16;
               }
               else
               {
                  crc = 0;

                  for (int i = 0; i < 32; i += 2)
                  {
                     int readoffset;
                     crc <<= 1;
                     if (index >= side_[side].tracks[track].revolution[rev].size)
                     {
                        readoffset = index % side_[side].tracks[track].revolution[rev].size;
                     }
                     else
                     {
                        readoffset = index;
                     }
                     unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[readoffset];
                     index += 2;
                     crc |= b & 0x1;
                  }

                  //
                  LOG("Track size is too small ?!!");
               }
               // Set status 1
               if (crc != crc_local.GetCRC())
               {
                  sector.data_crc_ok = false;
                  sector.status1 |= 0x20;
                  sector.status2 |= 0x20;
                  LOG("DATA CRC ERROR !");
               }
               else
               {
                  sector.data_crc_ok = true;
               }
               LOGEOL
               // Keep this to compute GAP3 size
               sector.index_end = index;

               if (index < side_[side].tracks[track].revolution[rev].size - 16)
               {
                  // End of sector. Look at the GAP until Sync is found - Only get it if different from 0x4E
                  byte = GetNextByteForRev(side, track, index, rev);
                  if (byte != 0x4E && byte != 0x4B)
                  {
                     sector.real_size += 2; // Add CRC + first gap

                     while ((memcmp(pattern_fe, &side_[side].tracks[track].revolution[rev].bitfield[index],
                                    sizeof(pattern_f)) != 0)
                        && (index < side_[side].tracks[track].revolution[rev].size - (int)sizeof(pattern_f)))
                     {
                        index += 16;
                        ++sector.real_size;
                        /*byte = GetNextByteForRev (side, track, index );
                        index += 16;*/
                     }
                  }
               }

               // NOTE : It can be a bit misalign, so sync bytes are watched on a bit basis
               // TODO

               track_buffer->list_sector_.push_back(sector);

               size += sector.real_size;

               // Adaptation: rewind to sector.DAMOffset to avoid forgetting interlaced sectors
               //index = sector.DAMOffset + 64 + 1;
               index = sector.idam_offset + 64 + 1;
            }
            else
            {
               ++index;
            }
         }

         // Next sector
      }
      else
      {
         ++index;
      }
   }

   // Avegare GAP3 size :
   int gap_3_total = 0;
   int offset_end = 0;
   if (track_buffer->list_sector_.size() > 0)
   {
      for (unsigned int i = 0; i < track_buffer->list_sector_.size(); i++)
      {
         if (i > 0)
         {
            gap_3_total += track_buffer->list_sector_[i].idam_offset - 24 - offset_end;
         }
         offset_end = track_buffer->list_sector_[i].index_end;
      }
      //gap_3_total += side_[side].Tracks[track].Revolution[0].Size - offset_end;

      track_buffer->gap3_size_ = gap_3_total / 16 / track_buffer->list_sector_.size();

      if ((size & 0xFFFFFF00) < size)
      {
         size += 0x100;
      }
      track_buffer->full_size_ = size;
   }
   else
   {
      track_buffer->full_size_ = 0;
   }


   // TODO : Compute real size of track
   return size;
}